

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_gf_active_quality(PRIMARY_RATE_CONTROL *p_rc,int q,aom_bit_depth_t bit_depth)

{
  int iVar1;
  undefined8 in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  
  iVar1 = get_gf_active_quality_no_rc
                    (unaff_retaddr_00,unaff_retaddr,(aom_bit_depth_t)((ulong)in_RDI >> 0x20));
  return iVar1;
}

Assistant:

static int get_gf_active_quality(const PRIMARY_RATE_CONTROL *const p_rc, int q,
                                 aom_bit_depth_t bit_depth) {
  return get_gf_active_quality_no_rc(p_rc->gfu_boost, q, bit_depth);
}